

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# star_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::StarExpression::DeserializeStarExpression
          (StarExpression *this,string *relation_name,case_insensitive_set_t *exclude_list,
          case_insensitive_map_t<unique_ptr<ParsedExpression>_> *replace_list,bool columns,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,bool unpacked,qualified_column_set_t *qualified_exclude_list,
          qualified_column_map_t<string> *rename_list)

{
  StarExpression *this_00;
  pointer pSVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  unpack_children;
  _Head_base<0UL,_duckdb::StarExpression_*,_false> local_b0;
  ExpressionType local_a1;
  _Head_base<0UL,_duckdb::StarExpression_*,_false> local_a0;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_98;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
  *local_90;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_88;
  _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_98._M_head_impl = &this->super_ParsedExpression;
  local_90 = (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              *)expr;
  this_00 = (StarExpression *)operator_new(0x110);
  ::std::
  _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&local_68,&qualified_exclude_list->_M_h);
  StarExpression(this_00,exclude_list,(qualified_column_set_t *)&local_68);
  local_b0._M_head_impl = this_00;
  ::std::
  _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  pSVar1 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_b0);
  ::std::__cxx11::string::operator=((string *)&pSVar1->relation_name,(string *)relation_name);
  pSVar1 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_b0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(pSVar1->replace_list)._M_h,&replace_list->_M_h);
  pSVar1 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_b0);
  pSVar1->columns = columns;
  pSVar1 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_b0);
  ::std::__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>::
  operator=((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             *)&pSVar1->expr,local_90);
  pSVar1 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_b0);
  ::std::
  _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(pSVar1->rename_list)._M_h,&rename_list->_M_h);
  local_a0._M_head_impl = local_b0._M_head_impl;
  if (unpacked) {
    local_88.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0._M_head_impl = (StarExpression *)0x0;
    local_88.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_88,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_a0);
    _Var2._M_head_impl = (ParsedExpression *)local_98;
    if (local_a0._M_head_impl != (StarExpression *)0x0) {
      (*((local_a0._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
        [1])();
    }
    local_a1 = OPERATOR_UNPACK;
    make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_a0,&local_a1,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_88);
    *(StarExpression **)_Var2._M_head_impl = local_a0._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_88);
    if (local_b0._M_head_impl != (StarExpression *)0x0) {
      (*((local_b0._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
        [1])();
    }
  }
  else {
    ((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression =
         (_func_int **)local_b0._M_head_impl;
    _Var2._M_head_impl = local_98._M_head_impl;
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         _Var2._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression>
StarExpression::DeserializeStarExpression(string &&relation_name, const case_insensitive_set_t &exclude_list,
                                          case_insensitive_map_t<unique_ptr<ParsedExpression>> &&replace_list,
                                          bool columns, unique_ptr<ParsedExpression> expr, bool unpacked,
                                          const qualified_column_set_t &qualified_exclude_list,
                                          qualified_column_map_t<string> &&rename_list) {
	auto result = duckdb::unique_ptr<StarExpression>(new StarExpression(exclude_list, qualified_exclude_list));
	result->relation_name = std::move(relation_name);
	result->replace_list = std::move(replace_list);
	result->columns = columns;
	result->expr = std::move(expr);
	result->rename_list = std::move(rename_list);
	if (unpacked) {
		//! This was previously a member of StarExpression, but not anymore
		//! We wrap it into an OPERATOR_UNPACK instead
		vector<unique_ptr<ParsedExpression>> unpack_children;
		unpack_children.push_back(std::move(result));
		return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_UNPACK, std::move(unpack_children));
	}
	return std::move(result);
}